

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void __thiscall helics::MessageHolder::freeMessage(MessageHolder *this,int index)

{
  bool bVar1;
  pointer pMVar2;
  int in_ESI;
  pointer in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  pointer __x;
  
  __x = in_RDI;
  bVar1 = isValidIndex<int,std::vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>>
                    (in_ESI,(vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                             *)in_RDI);
  if (bVar1) {
    std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::operator[]((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                  *)in_RDI,(long)in_ESI);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       0x1df61e);
    if (bVar1) {
      std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::operator[]((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                    *)in_RDI,(long)in_ESI);
      pMVar2 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                         ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                          0x1df63a);
      pMVar2->backReference = (void *)0x0;
      std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::operator[]((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                    *)in_RDI,(long)in_ESI);
      pMVar2 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                         ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                          0x1df65b);
      pMVar2->messageValidation = 0;
      std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::operator[]((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                    *)in_RDI,(long)in_ESI);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::reset
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI);
      std::vector<int,_std::allocator<int>_>::push_back(unaff_retaddr,(value_type_conflict1 *)__x);
    }
  }
  return;
}

Assistant:

void MessageHolder::freeMessage(int index)
{
    if (isValidIndex(index, messages)) {
        if (messages[index]) {
            messages[index]->backReference = nullptr;
            messages[index]->messageValidation = 0;
            messages[index].reset();
            freeMessageSlots.push_back(index);
        }
    }
}